

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

void __thiscall gl4cts::DirectStateAccess::Framebuffers::BlitTest::Clean(BlitTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  BlitTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo_src != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_src);
    this->m_fbo_src = 0;
  }
  if (this->m_fbo_dst != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_dst);
    this->m_fbo_dst = 0;
  }
  if (this->m_rbo_color_src != 0) {
    (**(code **)(lVar3 + 0x460))(1,&this->m_rbo_color_src);
    this->m_rbo_color_src = 0;
  }
  if (this->m_rbo_color_dst != 0) {
    (**(code **)(lVar3 + 0x460))(1,&this->m_rbo_color_dst);
    this->m_rbo_color_dst = 0;
  }
  if (this->m_rbo_depth_stencil_src != 0) {
    (**(code **)(lVar3 + 0x460))(1,&this->m_rbo_depth_stencil_src);
    this->m_rbo_depth_stencil_src = 0;
  }
  if (this->m_rbo_depth_stencil_dst != 0) {
    (**(code **)(lVar3 + 0x460))(1,&this->m_rbo_depth_stencil_dst);
    this->m_rbo_depth_stencil_dst = 0;
  }
  do {
    iVar1 = (**(code **)(lVar3 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void BlitTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Releasing objects. */
	if (m_fbo_src)
	{
		gl.deleteFramebuffers(1, &m_fbo_src);

		m_fbo_src = 0;
	}

	if (m_fbo_dst)
	{
		gl.deleteFramebuffers(1, &m_fbo_dst);

		m_fbo_dst = 0;
	}

	if (m_rbo_color_src)
	{
		gl.deleteRenderbuffers(1, &m_rbo_color_src);

		m_rbo_color_src = 0;
	}

	if (m_rbo_color_dst)
	{
		gl.deleteRenderbuffers(1, &m_rbo_color_dst);

		m_rbo_color_dst = 0;
	}

	if (m_rbo_depth_stencil_src)
	{
		gl.deleteRenderbuffers(1, &m_rbo_depth_stencil_src);

		m_rbo_depth_stencil_src = 0;
	}

	if (m_rbo_depth_stencil_dst)
	{
		gl.deleteRenderbuffers(1, &m_rbo_depth_stencil_dst);

		m_rbo_depth_stencil_dst = 0;
	}

	/* Errors clean up. */
	while (gl.getError())
		;
}